

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void P_DoDeferedScripts(void)

{
  EType EVar1;
  int flags;
  char *pcVar2;
  AActor *local_60;
  FString local_50;
  FString local_48 [3];
  FString local_30;
  acsdefered_t *local_28;
  acsdefered_t *def;
  FBehavior *pFStack_18;
  int i;
  FBehavior *module;
  ScriptPtr *scriptdata;
  
  def._4_4_ = TArray<acsdefered_t,_acsdefered_t>::Size(&(level.info)->deferred);
  while (def._4_4_ = def._4_4_ - 1, -1 < (int)def._4_4_) {
    local_28 = TArray<acsdefered_t,_acsdefered_t>::operator[]
                         (&(level.info)->deferred,(long)(int)def._4_4_);
    EVar1 = local_28->type;
    if (EVar1 < defsuspend) {
      module = (FBehavior *)FBehavior::StaticFindScript(local_28->script,&stack0xffffffffffffffe8);
      if (module == (FBehavior *)0x0) {
        ScriptPresentation((int)&local_30);
        pcVar2 = FString::GetChars(&local_30);
        Printf("P_DoDeferredScripts: Unknown %s\n",pcVar2);
        FString::~FString(&local_30);
      }
      else {
        if (((uint)local_28->playernum < 8) && ((playeringame[local_28->playernum] & 1U) != 0)) {
          local_60 = (AActor *)(&players)[(long)local_28->playernum * 0x54];
        }
        else {
          local_60 = (AActor *)0x0;
        }
        flags = 0;
        if (local_28->type == defexealways) {
          flags = 2;
        }
        P_GetScriptGoing(local_60,(line_t_conflict *)0x0,local_28->script,(ScriptPtr *)module,
                         pFStack_18,local_28->args,3,flags);
      }
    }
    else if (EVar1 == defsuspend) {
      SetScriptState(local_28->script,SCRIPT_Suspended);
      ScriptPresentation((int)local_48);
      pcVar2 = FString::GetChars(local_48);
      DPrintf(4,"Deferred suspend of %s\n",pcVar2);
      FString::~FString(local_48);
    }
    else if (EVar1 == defterminate) {
      SetScriptState(local_28->script,SCRIPT_PleaseRemove);
      ScriptPresentation((int)&local_50);
      pcVar2 = FString::GetChars(&local_50);
      DPrintf(4,"Deferred terminate of %s\n",pcVar2);
      FString::~FString(&local_50);
    }
  }
  TArray<acsdefered_t,_acsdefered_t>::Clear(&(level.info)->deferred);
  return;
}

Assistant:

void P_DoDeferedScripts ()
{
	const ScriptPtr *scriptdata;
	FBehavior *module;

	// Handle defered scripts in this step, too
	for(int i = level.info->deferred.Size()-1; i>=0; i--)
	{
		acsdefered_t *def = &level.info->deferred[i];
		switch (def->type)
		{
		case acsdefered_t::defexecute:
		case acsdefered_t::defexealways:
			scriptdata = FBehavior::StaticFindScript (def->script, module);
			if (scriptdata)
			{
				P_GetScriptGoing ((unsigned)def->playernum < MAXPLAYERS &&
					playeringame[def->playernum] ? players[def->playernum].mo : NULL,
					NULL, def->script,
					scriptdata, module,
					def->args, 3,
					def->type == acsdefered_t::defexealways ? ACS_ALWAYS : 0);
			}
			else
			{
				Printf ("P_DoDeferredScripts: Unknown %s\n", ScriptPresentation(def->script).GetChars());
			}
			break;

		case acsdefered_t::defsuspend:
			SetScriptState (def->script, DLevelScript::SCRIPT_Suspended);
			DPrintf (DMSG_SPAMMY, "Deferred suspend of %s\n", ScriptPresentation(def->script).GetChars());
			break;

		case acsdefered_t::defterminate:
			SetScriptState (def->script, DLevelScript::SCRIPT_PleaseRemove);
			DPrintf (DMSG_SPAMMY, "Deferred terminate of %s\n", ScriptPresentation(def->script).GetChars());
			break;
		}
	}
	level.info->deferred.Clear();
}